

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::shiftUp(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,size_t startIdx,size_t insertion_idx)

{
  Node *pNVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  Node *pNVar4;
  long lVar5;
  size_type sVar6;
  uint8_t *puVar7;
  InfoType IVar8;
  long lVar9;
  
  pNVar4 = this->mKeyVals;
  paVar2 = &pNVar4[startIdx].mData.first.field_2;
  pNVar1 = pNVar4 + startIdx;
  paVar3 = &pNVar4[startIdx - 1].mData.first.field_2;
  (&paVar2->_M_allocated_capacity)[-2] = (size_type)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar2->_M_allocated_capacity)[-7] == paVar3) {
    sVar6 = (&paVar3->_M_allocated_capacity)[1];
    paVar2->_M_allocated_capacity = paVar3->_M_allocated_capacity;
    (&paVar2->_M_allocated_capacity)[1] = sVar6;
  }
  else {
    (pNVar1->mData).first._M_dataplus._M_p = (pointer)(&paVar2->_M_allocated_capacity)[-7];
    (pNVar1->mData).first.field_2._M_allocated_capacity =
         pNVar1[-1].mData.first.field_2._M_allocated_capacity;
  }
  (pNVar1->mData).first._M_string_length = pNVar1[-1].mData.first._M_string_length;
  pNVar1[-1].mData.first._M_dataplus._M_p = (pointer)paVar3;
  pNVar1[-1].mData.first._M_string_length = 0;
  pNVar1[-1].mData.first.field_2._M_local_buf[0] = '\0';
  (pNVar1->mData).second = pNVar1[-1].mData.second;
  if (startIdx - 1 != insertion_idx) {
    lVar9 = (insertion_idx - startIdx) + 1;
    lVar5 = startIdx * 0x28;
    do {
      __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&this->mKeyVals[-2].mData.first._M_dataplus._M_p + lVar5);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&this->mKeyVals[-1].mData.first._M_dataplus._M_p + lVar5),__str);
      lVar9 = lVar9 + 1;
      __str[2]._M_string_length = (size_type)__str[1]._M_dataplus._M_p;
      lVar5 = lVar5 + -0x28;
    } while (lVar9 != 0);
  }
  if (startIdx != insertion_idx) {
    puVar7 = this->mInfo;
    IVar8 = this->mInfoInc;
    do {
      puVar7[startIdx] = (char)IVar8 + puVar7[startIdx - 1];
      puVar7 = this->mInfo;
      IVar8 = this->mInfoInc;
      if (0xff < puVar7[startIdx] + IVar8) {
        this->mMaxNumElementsAllowed = 0;
      }
      startIdx = startIdx - 1;
    } while (insertion_idx != startIdx);
  }
  return;
}

Assistant:

void
    shiftUp(size_t startIdx,
            size_t const insertion_idx) noexcept(std::is_nothrow_move_assignable<Node>::value) {
        auto idx = startIdx;
        ::new (static_cast<void*>(mKeyVals + idx)) Node(std::move(mKeyVals[idx - 1]));
        while (--idx != insertion_idx) {
            mKeyVals[idx] = std::move(mKeyVals[idx - 1]);
        }

        idx = startIdx;
        while (idx != insertion_idx) {
            ROBIN_HOOD_COUNT(shiftUp)
            mInfo[idx] = static_cast<uint8_t>(mInfo[idx - 1] + mInfoInc);
            if (ROBIN_HOOD_UNLIKELY(mInfo[idx] + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }
            --idx;
        }
    }